

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_sar_cc_arm(CPUARMState *env,uint32_t x,uint32_t i)

{
  int shift;
  uint32_t i_local;
  uint32_t x_local;
  CPUARMState *env_local;
  
  if ((i & 0xff) < 0x20) {
    env_local._4_4_ = x;
    if ((i & 0xff) != 0) {
      env->CF = x >> ((byte)i - 1 & 0x1f) & 1;
      env_local._4_4_ = (int)x >> ((byte)i & 0x1f);
    }
  }
  else {
    env->CF = x >> 0x1f;
    env_local._4_4_ = (int)x >> 0x1f;
  }
  return env_local._4_4_;
}

Assistant:

uint32_t HELPER(sar_cc)(CPUARMState *env, uint32_t x, uint32_t i)
{
    int shift = i & 0xff;
    if (shift >= 32) {
        env->CF = (x >> 31) & 1;
        return (int32_t)x >> 31;
    } else if (shift != 0) {
        env->CF = (x >> (shift - 1)) & 1;
        return (int32_t)x >> shift;
    }
    return x;
}